

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_gotoaddressdialog.h
# Opt level: O2

void __thiscall
Ui_GoToAddressDialog::retranslateUi(Ui_GoToAddressDialog *this,QDialog *GoToAddressDialog)

{
  QLabel *pQVar1;
  QArrayDataPointer<char16_t> local_38;
  
  QCoreApplication::translate((char *)&local_38,"GoToAddressDialog","Select item at address",0);
  QWidget::setWindowTitle((QString *)GoToAddressDialog);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QGroupBox::setTitle((QString *)this->groupBox);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  pQVar1 = this->label;
  QCoreApplication::translate((char *)&local_38,"GoToAddressDialog","Select item at address:",0);
  QLabel::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  return;
}

Assistant:

void retranslateUi(QDialog *GoToAddressDialog)
    {
        GoToAddressDialog->setWindowTitle(QCoreApplication::translate("GoToAddressDialog", "Select item at address", nullptr));
        groupBox->setTitle(QString());
        label->setText(QCoreApplication::translate("GoToAddressDialog", "Select item at address:", nullptr));
    }